

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

size_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::TotalCharge(ShardedLRUCache *this)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  sVar4 = 0;
  do {
    __mutex = (pthread_mutex_t *)(this->shard_[0].lru_.key_data + lVar3 + -0x74);
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_system_error(iVar2);
      }
      goto LAB_00d068e7;
    }
    sVar4 = sVar4 + *(long *)(this->shard_[0].lru_.key_data + lVar3 + -0x4c);
    pthread_mutex_unlock(__mutex);
    lVar3 = lVar3 + 0xd8;
  } while (lVar3 != 0xd80);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar4;
  }
LAB_00d068e7:
  __stack_chk_fail();
}

Assistant:

size_t TotalCharge() const override {
    size_t total = 0;
    for (int s = 0; s < kNumShards; s++) {
      total += shard_[s].TotalCharge();
    }
    return total;
  }